

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cParallelShaderCompileTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::CompilationCompletionParallelTest::iterate(CompilationCompletionParallelTest *this)

{
  CompilationCompletionParallelTest *pCVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  GLenum GVar5;
  GLuint GVar6;
  undefined4 extraout_var;
  deUint64 dVar7;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  int i_5;
  int i;
  long lVar8;
  GLint completionStatus;
  int fLengths [1];
  char *fSources [1];
  int vLengths [1];
  deUint32 fragmentShader [8];
  deUint32 program [8];
  char *vSources [1];
  Shader vertexShader;
  int local_114;
  CompilationCompletionParallelTest *local_110;
  ulong local_108;
  GLint local_fc;
  char *local_f8;
  int local_ec;
  GLuint aGStack_e8 [8];
  GLuint aGStack_c8 [10];
  char *local_a0;
  Shader local_98;
  Functions *gl;
  
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_ARB_parallel_shader_compile");
  if (bVar3) {
    iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    gl = (Functions *)CONCAT44(extraout_var,iVar4);
    (*gl->maxShaderCompilerThreadsARB)(8);
    GVar5 = (*gl->getError)();
    glu::checkError(GVar5,"maxShaderCompilerThreadsARB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0x123);
    lVar8 = 0;
    glu::Shader::Shader(&local_98,gl,SHADERTYPE_VERTEX);
    do {
      GVar6 = (*gl->createShader)(0x8b30);
      aGStack_e8[lVar8] = GVar6;
      GVar6 = (*gl->createProgram)();
      aGStack_c8[lVar8] = GVar6;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    local_a0 = 
    "#version 450\n\nin vec3 vertex;\n\nint main() {\n    gl_Position = vec4(vertex, 1);\n}\n";
    local_ec = 0x51;
    local_110 = this;
    glu::Shader::setSources(&local_98,1,&local_a0,&local_ec);
    lVar8 = 0;
    do {
      local_f8 = 
      "#version 450\n\nout ver4 fragColor;\n\nint main() {\n    fragColor = vec4(1, 1, 1, 1);\n}\n";
      local_fc = 0x54;
      (*gl->shaderSource)(aGStack_e8[lVar8],1,&local_f8,&local_fc);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    (*gl->compileShader)(local_98.m_shader);
    GVar5 = (*gl->getError)();
    glu::checkError(GVar5,"compileShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0x13d);
    lVar8 = 0;
    do {
      (*gl->compileShader)(aGStack_e8[lVar8]);
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"compileShader",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                      ,0x141);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    dVar7 = deGetMicroseconds();
    local_108 = dVar7 + 1000000;
    do {
      uVar2 = local_108;
      pCVar1 = local_110;
      dVar7 = deGetMicroseconds();
      if (uVar2 <= dVar7) {
        tcu::TestContext::setTestResult
                  ((pCVar1->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,
                   "Failed reading completion status for parallel shader compiling");
        lVar8 = 0;
        do {
          (*gl->deleteProgram)(aGStack_c8[lVar8]);
          (*gl->deleteShader)(aGStack_e8[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        goto LAB_00a75be9;
      }
      lVar8 = 0;
      iVar4 = 0;
      do {
        (*gl->getShaderiv)(aGStack_e8[lVar8],0x91b1,&local_114);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"getShaderiv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                        ,0x14d);
        iVar4 = (iVar4 + 1) - (uint)(local_114 == 0);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 8);
    } while (iVar4 != 8);
    lVar8 = 0;
    do {
      GVar6 = aGStack_c8[lVar8];
      (*gl->attachShader)(GVar6,local_98.m_shader);
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"attachShader",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                      ,0x162);
      (*gl->attachShader)(GVar6,aGStack_e8[lVar8]);
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"attachShader",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                      ,0x164);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    lVar8 = 0;
    do {
      (*gl->linkProgram)(aGStack_c8[lVar8]);
      GVar5 = (*gl->getError)();
      glu::checkError(GVar5,"linkProgram",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                      ,0x16b);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    dVar7 = deGetMicroseconds();
    local_108 = dVar7 + 1000000;
    do {
      uVar2 = local_108;
      pCVar1 = local_110;
      dVar7 = deGetMicroseconds();
      if (uVar2 <= dVar7) {
        tcu::TestContext::setTestResult
                  ((pCVar1->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,
                   "Failed reading completion status for parallel program linking");
        lVar8 = 0;
        do {
          (*gl->deleteProgram)(aGStack_c8[lVar8]);
          (*gl->deleteShader)(aGStack_e8[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
LAB_00a75be9:
        glu::Shader::~Shader(&local_98);
        return STOP;
      }
      lVar8 = 0;
      iVar4 = 0;
      do {
        (*gl->getProgramiv)(aGStack_c8[lVar8],0x91b1,&local_114);
        GVar5 = (*gl->getError)();
        glu::checkError(GVar5,"getProgramiv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                        ,0x177);
        pCVar1 = local_110;
        iVar4 = (iVar4 + 1) - (uint)(local_114 == 0);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 8);
    } while (iVar4 != 8);
    glu::Shader::~Shader(&local_98);
    this_00 = (pCVar1->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CompilationCompletionParallelTest::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_parallel_shader_compile"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
		return STOP;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLint completionStatus;

	gl.maxShaderCompilerThreadsARB(8);
	GLU_EXPECT_NO_ERROR(gl.getError(), "maxShaderCompilerThreadsARB");

	{
		Shader   vertexShader(gl, SHADERTYPE_VERTEX);
		deUint32 fragmentShader[8];
		deUint32 program[8];

		for (int i = 0; i < 8; ++i)
		{
			fragmentShader[i] = gl.createShader(GL_FRAGMENT_SHADER);
			program[i]		  = gl.createProgram();
		}

		const char* vSources[] = { vShader };
		const int   vLengths[] = { int(strlen(vShader)) };
		vertexShader.setSources(1, vSources, vLengths);

		//Compilation test
		for (int i = 0; i < 8; ++i)
		{
			const char* fSources[] = { fShader };
			const int   fLengths[] = { int(strlen(fShader)) };
			gl.shaderSource(fragmentShader[i], 1, fSources, fLengths);
		}

		gl.compileShader(vertexShader.getShader());
		GLU_EXPECT_NO_ERROR(gl.getError(), "compileShader");
		for (int i = 0; i < 8; ++i)
		{
			gl.compileShader(fragmentShader[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "compileShader");
		}

		{
			int		 completion  = 0;
			deUint64 shLoopStart = deGetMicroseconds();
			while (completion != 8 && deGetMicroseconds() < shLoopStart + 1000000)
			{
				completion = 0;
				for (int i = 0; i < 8; ++i)
				{
					gl.getShaderiv(fragmentShader[i], GL_COMPLETION_STATUS_ARB, &completionStatus);
					GLU_EXPECT_NO_ERROR(gl.getError(), "getShaderiv");
					if (completionStatus)
						completion++;
				}
			}
			if (completion != 8)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL,
										"Failed reading completion status for parallel shader compiling");
				for (int i = 0; i < 8; ++i)
				{
					gl.deleteProgram(program[i]);
					gl.deleteShader(fragmentShader[i]);
				}
				return STOP;
			}
		}

		for (int i = 0; i < 8; ++i)
		{
			gl.attachShader(program[i], vertexShader.getShader());
			GLU_EXPECT_NO_ERROR(gl.getError(), "attachShader");
			gl.attachShader(program[i], fragmentShader[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "attachShader");
		}

		//Linking test
		for (int i = 0; i < 8; ++i)
		{
			gl.linkProgram(program[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "linkProgram");
		}

		{
			int		 completion  = 0;
			deUint64 prLoopStart = deGetMicroseconds();
			while (completion != 8 && deGetMicroseconds() < prLoopStart + 1000000)
			{
				completion = 0;
				for (int i = 0; i < 8; ++i)
				{
					gl.getProgramiv(program[i], GL_COMPLETION_STATUS_ARB, &completionStatus);
					GLU_EXPECT_NO_ERROR(gl.getError(), "getProgramiv");
					if (completionStatus)
						completion++;
				}
			}
			if (completion != 8)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL,
										"Failed reading completion status for parallel program linking");
				for (int i = 0; i < 8; ++i)
				{
					gl.deleteProgram(program[i]);
					gl.deleteShader(fragmentShader[i]);
				}
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}